

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O0

void __thiscall
baryonyx::details::ap_file_observer::ap_file_observer
          (ap_file_observer *this,string_view filename,int m,int n,long param_4)

{
  int iVar1;
  allocator<float> local_45 [20];
  allocator<char> local_31;
  long local_30;
  long param_4_local;
  int n_local;
  int m_local;
  ap_file_observer *this_local;
  string_view filename_local;
  
  filename_local._M_len = (size_t)filename._M_str;
  this_local = (ap_file_observer *)filename._M_len;
  this->constraints = m;
  this->variables = n;
  this->m_frame = 0;
  local_30 = param_4;
  param_4_local._0_4_ = n;
  param_4_local._4_4_ = m;
  _n_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->m_basename,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_31);
  std::allocator<char>::~allocator(&local_31);
  iVar1 = this->variables;
  std::allocator<float>::allocator(local_45);
  std::vector<float,_std::allocator<float>_>::vector(&this->m_value,(long)iVar1,local_45);
  std::allocator<float>::~allocator(local_45);
  return;
}

Assistant:

ap_file_observer(const std::string_view filename,
                     int m,
                     int n,
                     long int /*loop*/)
      : constraints(m)
      , variables(n)
      , m_frame(0)
      , m_basename(std::move(filename))
      , m_value(variables)
    {}